

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

bool __thiscall pstore::sat_entry::is_valid(sat_entry *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  uint64_t uVar5;
  bool local_51;
  uint8_t *region_end;
  uint8_t *region_base;
  uint8_t *ptr;
  sat_entry *this_local;
  
  bVar1 = std::operator==(&this->value,(nullptr_t)0x0);
  if ((bVar1) && (bVar1 = std::operator==(&this->region,(nullptr_t)0x0), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    peVar2 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)this);
    peVar3 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->region);
    this_00 = &memory_mapper_base::data(peVar3)->
               super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    peVar3 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->region);
    uVar5 = memory_mapper_base::size(peVar3);
    local_51 = peVar4 <= peVar2 && (long)peVar2 + 0x400000U <= (long)peVar4 + uVar5;
    this_local._7_1_ = local_51;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid () const noexcept {
            if (value == nullptr && region == nullptr) {
                return true;
            }

            auto * const ptr = static_cast<std::uint8_t const *> (value.get ());
            auto * const region_base = static_cast<std::uint8_t const *> (region->data ().get ());
            auto * const region_end = region_base + region->size ();
            return ptr >= region_base && ptr + address::segment_size <= region_end;
        }